

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAfterEditSizeAdjust(JsonParse *pParse,u32 iRoot)

{
  u32 uVar1;
  int iVar2;
  u32 in_ESI;
  JsonParse *in_RDI;
  long in_FS_OFFSET;
  u32 nBlob;
  u32 sz;
  u32 in_stack_fffffffffffffff0;
  u32 uVar3;
  JsonParse *pParse_00;
  
  pParse_00 = *(JsonParse **)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  uVar1 = in_RDI->nBlob;
  in_RDI->nBlob = in_RDI->nBlobAlloc;
  jsonbPayloadSize(in_RDI,in_ESI,(u32 *)&stack0xfffffffffffffff4);
  in_RDI->nBlob = uVar1;
  iVar2 = jsonBlobChangePayloadSize(pParse_00,uVar3 + in_RDI->delta,in_stack_fffffffffffffff0);
  in_RDI->delta = in_RDI->delta + iVar2;
  if (*(JsonParse **)(in_FS_OFFSET + 0x28) == pParse_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonAfterEditSizeAdjust(JsonParse *pParse, u32 iRoot){
  u32 sz = 0;
  u32 nBlob;
  assert( pParse->delta!=0 );
  assert( pParse->nBlobAlloc >= pParse->nBlob );
  nBlob = pParse->nBlob;
  pParse->nBlob = pParse->nBlobAlloc;
  (void)jsonbPayloadSize(pParse, iRoot, &sz);
  pParse->nBlob = nBlob;
  sz += pParse->delta;
  pParse->delta += jsonBlobChangePayloadSize(pParse, iRoot, sz);
}